

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CodeSinkingPass::HasPossibleStore(CodeSinkingPass *this,Instruction *var_inst)

{
  Instruction *def;
  Op OVar1;
  DefUseManager *this_00;
  bool bVar2;
  anon_class_8_1_8991fb9c local_40;
  function<bool_(spvtools::opt::Instruction_*)> local_38;
  Instruction *local_18;
  Instruction *var_inst_local;
  CodeSinkingPass *this_local;
  
  local_18 = var_inst;
  var_inst_local = (Instruction *)this;
  OVar1 = opt::Instruction::opcode(var_inst);
  bVar2 = true;
  if (OVar1 != OpVariable) {
    OVar1 = opt::Instruction::opcode(local_18);
    bVar2 = true;
    if (OVar1 != OpAccessChain) {
      OVar1 = opt::Instruction::opcode(local_18);
      bVar2 = OVar1 == OpPtrAccessChain;
    }
  }
  if (!bVar2) {
    __assert_fail("var_inst->opcode() == spv::Op::OpVariable || var_inst->opcode() == spv::Op::OpAccessChain || var_inst->opcode() == spv::Op::OpPtrAccessChain"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp"
                  ,0x117,"bool spvtools::opt::CodeSinkingPass::HasPossibleStore(Instruction *)");
  }
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  def = local_18;
  local_40.this = this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::CodeSinkingPass::HasPossibleStore(spvtools::opt::Instruction*)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_38,&local_40);
  bVar2 = analysis::DefUseManager::WhileEachUser(this_00,def,&local_38);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_38);
  return bVar2;
}

Assistant:

bool CodeSinkingPass::HasPossibleStore(Instruction* var_inst) {
  assert(var_inst->opcode() == spv::Op::OpVariable ||
         var_inst->opcode() == spv::Op::OpAccessChain ||
         var_inst->opcode() == spv::Op::OpPtrAccessChain);

  return get_def_use_mgr()->WhileEachUser(var_inst, [this](Instruction* use) {
    switch (use->opcode()) {
      case spv::Op::OpStore:
        return true;
      case spv::Op::OpAccessChain:
      case spv::Op::OpPtrAccessChain:
        return HasPossibleStore(use);
      default:
        return false;
    }
  });
}